

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_size_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_12c2b3::ByteSizeTest_UnpopulatedMsg_Test::~ByteSizeTest_UnpopulatedMsg_Test
          (ByteSizeTest_UnpopulatedMsg_Test *this)

{
  ByteSizeTest_UnpopulatedMsg_Test *this_local;
  
  ~ByteSizeTest_UnpopulatedMsg_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ByteSizeTest, UnpopulatedMsg) {
  upb_Arena* arena = upb_Arena_New();
  protobuf_test_messages_proto2_TestAllTypesProto2* msg =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(arena);
  auto res = upb_ByteSize(UPB_UPCAST(msg), kTestMiniTable);
  EXPECT_EQ(res, 0);
  upb_Arena_Free(arena);
}